

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value.hpp
# Opt level: O0

void __thiscall
toml::basic_value<toml::type_config>::basic_value
          (basic_value<toml::type_config> *this,local_datetime_type x,local_datetime_format_info fmt
          ,vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *com,region_type *reg)

{
  value_type v;
  format_type f;
  undefined6 uVar1;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_RSI;
  undefined1 *in_RDI;
  region *this_00;
  size_t in_R8;
  region *in_stack_00000008;
  
  uVar1 = (undefined6)in_RDX;
  *in_RDI = 6;
  v.time.millisecond = (short)uVar1;
  v.time.microsecond = (short)((uint6)uVar1 >> 0x10);
  v.time.nanosecond = (short)((uint6)uVar1 >> 0x20);
  v._0_8_ = in_RSI;
  f.subsecond_precision = in_R8;
  f._0_8_ = in_RCX;
  toml::detail::value_with_format<toml::local_datetime,_toml::local_datetime_format_info>::
  value_with_format((value_with_format<toml::local_datetime,_toml::local_datetime_format_info> *)
                    (in_RDI + 8),v,f);
  this_00 = (region *)(in_RDI + 0x48);
  toml::detail::region::region(this_00,in_stack_00000008);
  preserve_comments::preserve_comments
            ((preserve_comments *)this_00,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)in_stack_00000008);
  return;
}

Assistant:

basic_value(local_datetime_type x, local_datetime_format_info fmt,
                std::vector<std::string> com, region_type reg)
        : type_(value_t::local_datetime), local_datetime_(local_datetime_storage(x, fmt)),
          region_(std::move(reg)), comments_(std::move(com))
    {}